

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall r_comp::Compiler::hlp_reference(Compiler *this,Ptr *node,uint16_t *index)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  size_type sVar4;
  reference __rhs;
  byte local_29;
  uint8_t i;
  uint16_t *index_local;
  Ptr *node_local;
  Compiler *this_local;
  
  peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar1 = std::operator!=(&peVar3->label,"");
  if (!bVar1) {
    for (local_29 = 0;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->hlp_references), local_29 < sVar4; local_29 = local_29 + 1) {
      peVar3 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->hlp_references,(ulong)local_29);
      _Var2 = std::operator==(&peVar3->cmd,__rhs);
      if (_Var2) {
        *index = (ushort)local_29;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Compiler::hlp_reference(RepliStruct::Ptr node, uint16_t &index)
{
    if (node->label != "") {
        return false;
    }

    for (uint8_t i = 0; i < hlp_references.size(); ++i) {
        if (node->cmd == hlp_references[i]) {
            index = i;
            return true;
        }
    }

    return false;
}